

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_tuple_demo.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2.7);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
  Customer customer(1, 2.7F);

  // Access tuple elements through their name (type)
  // Element name resolution is done at compile-time. The naming of the tuple
  // elements is essentially free
  std::cout << customer.get<CustomerId>() << std::endl;
  std::cout << customer.get<Balance>() << std::endl;

  return EXIT_SUCCESS;
}